

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall Pathie::Path::Path(Path *this,string *path)

{
  string *path_local;
  Path *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)path);
  sanitize(this);
  return;
}

Assistant:

Path::Path(std::string path)
{
  m_path = path;
  sanitize();
}